

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

void __thiscall despot::Adventurer::PrintTransitions(Adventurer *this)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined8 uVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Transitions (Start)",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  iVar2 = (**(code **)(*(long *)this + 0xf8))(this);
  if (0 < iVar2) {
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "--------------------------------------------------------------------------------",
                 0x50);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"State ",6);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      uVar4 = (**(code **)(*(long *)this + 0x108))(this,uVar10 & 0xffffffff);
      (**(code **)(*(long *)this + 0x88))(this,uVar4,&std::cout);
      iVar2 = (**(code **)(*(long *)this + 0x28))(this);
      if (0 < iVar2) {
        lVar8 = 0;
        do {
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," outcomes for action ",0x15);
          plVar3 = (long *)std::ostream::operator<<((ostream *)poVar5,(int)lVar8);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          lVar7 = *(long *)&(this->transition_probabilities_).
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          lVar6 = *(long *)(lVar7 + lVar8 * 0x18);
          if (*(long *)(lVar7 + 8 + lVar8 * 0x18) != lVar6) {
            lVar7 = 0xc;
            uVar9 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Next = (",8)
              ;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar6 + lVar7));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
              poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar6 + 0xc + lVar7));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              uVar4 = (**(code **)(*(long *)this + 0x108))(this,*(undefined4 *)(lVar6 + lVar7));
              (**(code **)(*(long *)this + 0x88))(this,uVar4,&std::cout);
              uVar9 = uVar9 + 1;
              lVar1 = *(long *)&(this->transition_probabilities_).
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              lVar6 = *(long *)(lVar1 + lVar8 * 0x18);
              lVar7 = lVar7 + 0x20;
            } while (uVar9 < (ulong)(*(long *)(lVar1 + 8 + lVar8 * 0x18) - lVar6 >> 5));
          }
          lVar8 = lVar8 + 1;
          iVar2 = (**(code **)(*(long *)this + 0x28))();
        } while (lVar8 < iVar2);
      }
      uVar10 = uVar10 + 1;
      iVar2 = (**(code **)(*(long *)this + 0xf8))();
    } while ((long)uVar10 < (long)iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Transitions (End)",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return;
}

Assistant:

void Adventurer::PrintTransitions() const {
	cout << "Transitions (Start)" << endl;
	for (int s = 0; s < NumStates(); s++) {
		cout
			<< "--------------------------------------------------------------------------------"
			<< endl;
		cout << "State " << s << endl;
		PrintState(*GetState(s));
		for (int a = 0; a < NumActions(); a++) {
			cout << transition_probabilities_[s][a].size()
				<< " outcomes for action " << a << endl;
			for (int i = 0; i < transition_probabilities_[s][a].size(); i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << "Next = (" << next.state_id << ", " << next.weight
					<< ")" << endl;
				PrintState(*GetState(next.state_id));
			}
		}
	}
	cout << "Transitions (End)" << endl;
}